

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateQueryUtil.hpp
# Opt level: O0

bool __thiscall
deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<void_*>::isUndefined
          (StateQueryMemoryWriteGuard<void_*> *this)

{
  ulong local_20;
  size_t i;
  StateQueryMemoryWriteGuard<void_*> *this_local;
  
  local_20 = 0;
  while( true ) {
    if (7 < local_20) {
      return true;
    }
    if (*(char *)((long)&this->m_value + local_20) != -0x22) break;
    local_20 = local_20 + 1;
  }
  return false;
}

Assistant:

bool StateQueryMemoryWriteGuard<T>::isUndefined () const
{
	for (size_t i = 0; i < sizeof(T); ++i)
		if (((deUint8*)&m_value)[i] != (deUint8)WRITE_GUARD_VALUE)
			return false;
	return true;
}